

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

bool __thiscall dtc::fdt::device_tree::parse_define(device_tree *this,char *def)

{
  char *pcVar1;
  tuple<dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_> tVar2;
  size_t sVar3;
  __shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  __uniq_ptr_impl<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> local_1a0;
  property_ptr p;
  string name;
  undefined1 local_160 [40];
  pointer local_138;
  pointer ppStack_130;
  string local_128;
  string name_copy;
  text_input_buffer in;
  
  pcVar1 = strchr(def,0x3d);
  if (pcVar1 == (char *)0x0) {
    if (*def == '\0') {
      bVar4 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in,def,(allocator<char> *)local_160);
      std::__detail::
      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&this->defines,(key_type *)&in);
      std::__cxx11::string::~string((string *)&in);
      bVar4 = true;
    }
  }
  else {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,def,pcVar1);
    std::__cxx11::string::string((string *)&name_copy,(string *)&name);
    tVar2.super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
    super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>)
         operator_new(0x18);
    sVar3 = strlen(pcVar1 + 1);
    *(undefined ***)
     tVar2.super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
     super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl =
         &PTR_filename_abi_cxx11__0014f258;
    *(char **)((long)tVar2.
                     super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>
                     .super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl + 8) =
         pcVar1 + 1;
    *(int *)((long)tVar2.
                   super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>
                   .super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl + 0x10) =
         (int)sVar3;
    *(undefined4 *)
     ((long)tVar2.
            super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
            super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl + 0x14) = 0;
    local_160._8_8_ = 1;
    local_160._16_8_ = (_Hash_node_base *)0x0;
    local_160._24_8_ = (__node_base_ptr)0x0;
    local_160._32_8_ = (pointer)0x3f800000;
    local_138 = (pointer)0x0;
    ppStack_130 = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_1a0._M_t.
    super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
    super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl =
         (tuple<dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>)
         (tuple<dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>)
         tVar2.super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
         super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl;
    local_160._0_8_ = &ppStack_130;
    text_input_buffer::text_input_buffer
              (&in,(unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)
                   &local_1a0,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_160,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p,&local_128,(FILE *)0x0);
    std::__cxx11::string::~string((string *)&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&p);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_160);
    local_160._8_8_ = 1;
    local_160._16_8_ = (_Hash_node_base *)0x0;
    local_160._24_8_ = (__node_base_ptr)0x0;
    local_160._32_8_ = (pointer)0x3f800000;
    local_138 = (pointer)0x0;
    ppStack_130 = (pointer)0x0;
    local_160._0_8_ = &ppStack_130;
    property::parse((property *)&p,&in,&name_copy,(string_set *)local_160,false,(define_map *)0x0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_160);
    if (p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      bVar4 = false;
    }
    else {
      this_00 = &std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->defines,&name)->
                 super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>);
      bVar4 = p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    text_input_buffer::~text_input_buffer(&in);
    if ((_Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>)
        local_1a0._M_t.
        super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>.
        super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl != (input_buffer *)0x0) {
      (**(code **)(*(long *)local_1a0._M_t.
                            super__Tuple_impl<0UL,_dtc::input_buffer_*,_std::default_delete<dtc::input_buffer>_>
                            .super__Head_base<0UL,_dtc::input_buffer_*,_false>._M_head_impl + 0x10))
                ();
    }
    std::__cxx11::string::~string((string *)&name_copy);
    std::__cxx11::string::~string((string *)&name);
  }
  return bVar4;
}

Assistant:

bool device_tree::parse_define(const char *def)
{
	const char *val = strchr(def, '=');
	if (!val)
	{
		if (strlen(def) != 0)
		{
			string name(def);
			defines[name];
			return true;
		}
		return false;
	}
	string name(def, val-def);
	string name_copy = name;
	val++;
	std::unique_ptr<input_buffer> raw(new input_buffer(val, strlen(val)));
	text_input_buffer in(std::move(raw),
	                     std::unordered_set<string>(),
	                     std::vector<string>(),
	                     string(),
	                     nullptr);
	property_ptr p = property::parse(in, std::move(name_copy), string_set(), false);
	if (p)
		defines[name] = p;
	return (bool)p;
}